

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
          (IndirectDispatchCaseBufferUpload *this,TestContext *testCtx,DispatchCaseDesc *caseDesc,
          GLSLVersion glslVersion)

{
  char *pcVar1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  GLSLVersion local_24;
  DispatchCaseDesc *pDStack_20;
  GLSLVersion glslVersion_local;
  DispatchCaseDesc *caseDesc_local;
  TestContext *testCtx_local;
  IndirectDispatchCaseBufferUpload *this_local;
  
  pcVar1 = caseDesc->m_name;
  local_24 = glslVersion;
  pDStack_20 = caseDesc;
  caseDesc_local = (DispatchCaseDesc *)testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar1,&local_49);
  pcVar1 = pDStack_20->m_description;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_48,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IndirectDispatchCaseBufferUpload_016aed10;
  this->m_bufferSize = pDStack_20->m_bufferSize;
  tcu::Vector<unsigned_int,_3>::Vector(&this->m_workGroupSize,&pDStack_20->m_workGroupSize);
  std::
  vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
  ::vector(&this->m_dispatchCommands,&pDStack_20->m_dispatchCommands);
  this->m_glslVersion = local_24;
  return;
}

Assistant:

IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload (tcu::TestContext&		testCtx,
																	const DispatchCaseDesc& caseDesc,
																	const glu::GLSLVersion	glslVersion)
	: vkt::TestCase			(testCtx, caseDesc.m_name, caseDesc.m_description)
	, m_bufferSize			(caseDesc.m_bufferSize)
	, m_workGroupSize		(caseDesc.m_workGroupSize)
	, m_dispatchCommands	(caseDesc.m_dispatchCommands)
	, m_glslVersion			(glslVersion)
{
}